

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLChar.cpp
# Opt level: O0

bool xercesc_4_0::XMLChar1_1::containsWhiteSpace(XMLCh *toCheck,XMLSize_t count)

{
  XMLCh XVar1;
  XMLCh *endPtr;
  XMLCh *curCh;
  XMLSize_t count_local;
  XMLCh *toCheck_local;
  
  if (count == 0) {
    toCheck_local._7_1_ = false;
  }
  else {
    endPtr = toCheck;
    do {
      if (toCheck + count <= endPtr) {
        return false;
      }
      XVar1 = *endPtr;
      endPtr = endPtr + 1;
    } while (((&fgCharCharsTable1_1)[(ushort)XVar1] & 0x80) == 0);
    toCheck_local._7_1_ = true;
  }
  return toCheck_local._7_1_;
}

Assistant:

bool XMLChar1_1::containsWhiteSpace(const   XMLCh* const    toCheck
                                    , const XMLSize_t       count)
{
    if (count == 0)
        return false;

    const XMLCh* curCh = toCheck;
    const XMLCh* endPtr = toCheck + count;
    while (curCh < endPtr)
    {
        if (fgCharCharsTable1_1[*curCh++] & gWhitespaceCharMask)
            return true;
    }
    return false;
}